

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall
kratos::FSMState::output
          (FSMState *this,shared_ptr<kratos::Var> *output_var,shared_ptr<kratos::Var> *value_var)

{
  _Rb_tree_header *p_Var1;
  VarException *this_00;
  mapped_type *ppVVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  mapped_type local_80;
  string local_78;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  element_type *local_38;
  element_type *value;
  element_type *output;
  
  value = (output_var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (value_var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->output_values_)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(element_type **)(p_Var3 + 1) >= value) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(element_type **)(p_Var3 + 1) < value];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(element_type **)(p_Var4 + 1) <= value)) {
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_78,(detail *)"{0} already has specified output",(string_view)ZEXT816(0x20),
                 args);
      ppVVar2 = std::
                map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                ::at(&this->output_values_,&value);
      local_80 = *ppVVar2;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_80;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_58,__l,(allocator_type *)((long)&output + 7));
      VarException::VarException(this_00,&local_78,&local_58);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
            ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&this->output_ordering_,&value);
  std::
  _Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Var*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
  ::_M_emplace_unique<kratos::Var*&,kratos::Var*&>
            ((_Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Var*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
              *)&this->output_values_,&value,&local_38);
  return;
}

Assistant:

void FSMState::output(const std::shared_ptr<Var>& output_var,
                      const std::shared_ptr<Var>& value_var) {
    auto* output = output_var.get();
    auto* value = value_var.get();
    if (output_values_.find(output) != output_values_.end()) {
        throw VarException(::format("{0} already has specified output"),
                           {output_values_.at(output)});
    }
    output_ordering_.emplace_back(output);
    output_values_.emplace(output, value);
}